

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::ExtractSubrange
          (RepeatedField<unsigned_long> *this,int start,int num,unsigned_long *elements)

{
  int iVar1;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  LogFinisher local_e5;
  int local_e4;
  ulong local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar5 = (ulong)(uint)num;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2d9);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2da);
    pLVar2 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar2);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  iVar6 = num + start;
  if (this->current_size_ < iVar6) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2db);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_e5,pLVar2);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  local_e4 = iVar6;
  local_e0 = uVar5;
  if (0 < num && elements != (unsigned_long *)0x0) {
    uVar7 = 0;
    do {
      puVar3 = Get(this,(int)uVar7 + start);
      elements[uVar7] = *puVar3;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  iVar6 = (int)local_e0;
  if (0 < iVar6) {
    iVar1 = this->current_size_;
    if (local_e4 < iVar1) {
      do {
        puVar3 = Get(this,iVar6 + start);
        Set(this,start,puVar3);
        iVar1 = this->current_size_;
        iVar4 = iVar6 + start;
        start = start + 1;
      } while (iVar4 + 1 < iVar1);
    }
    if (0 < this->current_size_) {
      this->current_size_ = iVar1 - iVar6;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}